

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Class.cpp
# Opt level: O0

Class * __thiscall hdc::Class::getName_abi_cxx11_(Class *this)

{
  string *psVar1;
  long in_RSI;
  Class *this_local;
  
  psVar1 = Token::getLexem_abi_cxx11_((Token *)(in_RSI + 0x28));
  std::__cxx11::string::string((string *)this,(string *)psVar1);
  return this;
}

Assistant:

std::string Class::getName() {
    return name.getLexem();
}